

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

bool __thiscall despot::TabularCPT::Validate(TabularCPT *this)

{
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *vars;
  NamedVar *pNVar1;
  pointer pbVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar12;
  vector<int,_std::allocator<int>_> index;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar3 = (*(this->super_CPT).super_Function._vptr_Function[7])();
  uVar4 = (*(this->super_CPT).super_Function._vptr_Function[9])(this);
  bVar6 = (int)uVar3 < 1;
  if (0 < (int)uVar3) {
    uVar8 = 0;
    do {
      dVar12 = 0.0;
      if (0 < (int)uVar4) {
        uVar7 = 0;
        do {
          (*(this->super_CPT).super_Function._vptr_Function[4])(this,uVar8,uVar7);
          dVar12 = dVar12 + extraout_XMM0_Qa;
          uVar11 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar11;
        } while (uVar4 != uVar11);
      }
      if (1e-06 < ABS(dVar12 + -1.0)) {
        vars = &(this->super_CPT).super_Function.parents_;
        Variable::ComputeIndexVec(&local_48,vars,(int)uVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR: Probabilities do not sum to one when parents = [",
                   0x37);
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          uVar7 = 0;
          do {
            pcVar9 = ", ";
            if (uVar7 == 0) {
              pcVar9 = "";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,pcVar9,(ulong)((uint)(uVar7 != 0) * 2));
            pNVar1 = (vars->
                     super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar7];
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(pNVar1->name_)._M_dataplus._M_p,
                                (pNVar1->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=",1);
            lVar10 = *(long *)&((vars->
                                super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar7]->super_Variable).
                               values_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,*(char **)(lVar10 + (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar7] *
                                                  0x20),
                       *(long *)(lVar10 + 8 +
                                (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start[uVar7] * 0x20));
            uVar7 = uVar7 + 1;
          } while (uVar7 < (ulong)((long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"]",1);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
        std::ostream::put('\x18');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," Sum = ",7);
        poVar5 = std::ostream::_M_insert<double>(dVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; Entries: [",0xc);
        if (0 < (int)uVar4) {
          lVar10 = 8;
          uVar7 = 0;
          do {
            pcVar9 = ", ";
            if (uVar7 == 0) {
              pcVar9 = "";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,pcVar9,(ulong)((uint)(uVar7 != 0) * 2));
            pbVar2 = (((this->super_CPT).super_Function.child_)->super_Variable).values_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,*(char **)((long)pbVar2 + lVar10 + -8),
                                *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=",1);
            (*(this->super_CPT).super_Function._vptr_Function[4])(this,uVar8,uVar7 & 0xffffffff);
            std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
            uVar7 = uVar7 + 1;
            lVar10 = lVar10 + 0x20;
          } while (uVar4 != uVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"]",1);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
        std::ostream::put('\x18');
        std::ostream::flush();
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == (pointer)0x0) {
          return bVar6;
        }
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        return bVar6;
      }
      uVar11 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar11;
      bVar6 = (int)uVar3 <= (int)uVar11;
    } while (uVar11 != uVar3);
  }
  return bVar6;
}

Assistant:

bool TabularCPT::Validate() const {
	int parent_size = ParentSize(), child_size = ChildSize();

	for (int p = 0; p < parent_size; p++) {
		double sum = 0;
		for (int c = 0; c < child_size; c++) {
			sum += GetValue(p, c);
		}

		if (fabs(sum - 1.0) > 1e-6) {
			vector<int> index = Variable::ComputeIndexVec(parents_, p);
			cerr << "ERROR: Probabilities do not sum to one when parents = [";
			for (int i = 0; i < index.size(); i++) {
				cerr << (i == 0 ? "" : ", ") << parents_[i]->name() << "="
					<< parents_[i]->GetValue(index[i]);
			}
			cerr << "]" << endl;

			cerr << " Sum = " << sum << "; Entries: [";
			for (int i = 0; i < child_size; i++) {
				cerr << (i == 0 ? "" : ", ") << child_->GetValue(i) << "="
					<< GetValue(p, i);
			}
			cerr << "]" << endl;

			return false;
		}
	}

	return true;
}